

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

string * qclab::io::left_of(string *__return_storage_ptr__,string *str,string *delimiter)

{
  pointer pcVar1;
  long lVar2;
  long *local_38 [2];
  long local_28 [2];
  
  lVar2 = std::__cxx11::string::find_first_of((char *)str,(ulong)(delimiter->_M_dataplus)._M_p,0);
  if (lVar2 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  }
  else if (lVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
    std::__cxx11::string::substr((ulong)local_38,(ulong)str);
    std::__cxx11::string::operator=((string *)str,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string left_of( std::string& str , const std::string delimiter ) {
    auto pos = str.find_first_of( delimiter ) ;
    if ( pos == 0 ) {
      return "" ;
    } else if ( pos == std::string::npos ) {
      return str ;
    }
    std::string left_of = str.substr( 0 , pos ) ;
    str = str.substr( pos + 1 ) ;
    return left_of ;
  }